

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseReserved
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  undefined1 local_58 [8];
  LocationRecorder location_1;
  undefined1 local_38 [8];
  LocationRecorder location;
  LocationRecorder *message_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  location.location_ = (Location *)message_location;
  bVar1 = Consume(this,"reserved");
  if (bVar1) {
    bVar1 = LookingAtType(this,TYPE_STRING);
    if (bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_38,(LocationRecorder *)location.location_,10);
      this_local._7_1_ = ParseReservedNames(this,message,(LocationRecorder *)local_38);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_38);
    }
    else {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_58,(LocationRecorder *)location.location_,9);
      this_local._7_1_ = ParseReservedNumbers(this,message,(LocationRecorder *)local_58);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseReserved(DescriptorProto* message,
                           const LocationRecorder& message_location) {
  // Parse the declaration.
  DO(Consume("reserved"));
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    LocationRecorder location(message_location,
                              DescriptorProto::kReservedNameFieldNumber);
    return ParseReservedNames(message, location);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kReservedRangeFieldNumber);
    return ParseReservedNumbers(message, location);
  }
}